

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

bool __thiscall cmQtAutoGenInitializer::SetupWriteAutogenInfo(cmQtAutoGenInitializer *this)

{
  char cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  cmGeneratorTarget *pcVar3;
  uint uVar4;
  __node_base *p_Var5;
  char *pcVar6;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *p_Var7;
  anon_class_8_1_ea5e79e8 MfDef;
  string err;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uic_skip;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sources;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  moc_skip;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uic_sources;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uic_headers;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  moc_sources;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  moc_headers;
  InfoWriter ofs;
  allocator<char> local_44a;
  allocator<char> local_449;
  cmMakefile *local_448;
  undefined1 local_440 [32];
  _Base_ptr local_420;
  size_t local_418;
  string local_410;
  uint local_3ec;
  string local_3e8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_398;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_368;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_338;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_308;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  undefined1 local_278 [584];
  
  InfoWriter::InfoWriter((InfoWriter *)local_278,&(this->AutogenTarget).InfoFile);
  uVar4 = *(uint *)(*(_func_int **)(local_278._0_8_ + -0x18) + (long)(local_278 + 0x20));
  if ((uVar4 & 5) == 0) {
    local_448 = this->Target->Target->Makefile;
    std::operator<<((ostream *)local_278,"# Meta\n");
    pcVar6 = "FALSE";
    if (this->MultiConfig != false) {
      pcVar6 = "TRUE";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_440,pcVar6,(allocator<char> *)&local_398);
    InfoWriter::Write((InfoWriter *)local_278,"AM_MULTI_CONFIG",(string *)local_440);
    std::__cxx11::string::~string((string *)local_440);
    InfoWriter::Write((InfoWriter *)local_278,"AM_PARALLEL",&(this->AutogenTarget).Parallel);
    InfoWriter::Write((InfoWriter *)local_278,"AM_VERBOSITY",&this->Verbosity);
    std::operator<<((ostream *)local_278,"# Directories\n");
    SetupWriteAutogenInfo()::$_0::operator()[abi_cxx11_
              ((string *)local_440,&local_448,"CMAKE_SOURCE_DIR");
    InfoWriter::Write((InfoWriter *)local_278,"AM_CMAKE_SOURCE_DIR",(string *)local_440);
    std::__cxx11::string::~string((string *)local_440);
    SetupWriteAutogenInfo()::$_0::operator()[abi_cxx11_
              ((string *)local_440,&local_448,"CMAKE_BINARY_DIR");
    InfoWriter::Write((InfoWriter *)local_278,"AM_CMAKE_BINARY_DIR",(string *)local_440);
    std::__cxx11::string::~string((string *)local_440);
    SetupWriteAutogenInfo()::$_0::operator()[abi_cxx11_
              ((string *)local_440,&local_448,"CMAKE_CURRENT_SOURCE_DIR");
    InfoWriter::Write((InfoWriter *)local_278,"AM_CMAKE_CURRENT_SOURCE_DIR",(string *)local_440);
    std::__cxx11::string::~string((string *)local_440);
    SetupWriteAutogenInfo()::$_0::operator()[abi_cxx11_
              ((string *)local_440,&local_448,"CMAKE_CURRENT_BINARY_DIR");
    InfoWriter::Write((InfoWriter *)local_278,"AM_CMAKE_CURRENT_BINARY_DIR",(string *)local_440);
    std::__cxx11::string::~string((string *)local_440);
    SetupWriteAutogenInfo()::$_0::operator()[abi_cxx11_
              ((string *)local_440,&local_448,"CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE");
    InfoWriter::Write((InfoWriter *)local_278,"AM_CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE",
                      (string *)local_440);
    std::__cxx11::string::~string((string *)local_440);
    InfoWriter::Write((InfoWriter *)local_278,"AM_BUILD_DIR",&(this->Dir).Build);
    InfoWriter::Write((InfoWriter *)local_278,"AM_INCLUDE_DIR",&(this->Dir).Include);
    InfoWriter::WriteConfig((InfoWriter *)local_278,"AM_INCLUDE_DIR",&(this->Dir).ConfigInclude);
    local_440._24_8_ = local_440 + 8;
    local_440._8_4_ = _S_red;
    local_440._16_8_ = 0;
    local_418 = 0;
    local_398._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_398._M_impl.super__Rb_tree_header._M_header;
    local_398._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_398._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_398._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_2a8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_2a8._M_impl.super__Rb_tree_header._M_header;
    local_2a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_2a8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_2d8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_2d8._M_impl.super__Rb_tree_header._M_header;
    local_2d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_2d8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_368._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_368._M_impl.super__Rb_tree_header._M_header;
    local_368._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_368._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_368._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_308._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_308._M_impl.super__Rb_tree_header._M_header;
    local_308._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_308._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_308._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_338._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_338._M_impl.super__Rb_tree_header._M_header;
    local_338._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_338._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_338._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_3c8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_3c8._M_impl.super__Rb_tree_header._M_header;
    local_3c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_3c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_3c8._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var5 = &(this->AutogenTarget).Headers._M_h._M_before_begin;
    local_420 = (_Base_ptr)local_440._24_8_;
    local_3ec = uVar4;
    local_3c8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_3c8._M_impl.super__Rb_tree_header._M_header._M_left;
    local_398._M_impl.super__Rb_tree_header._M_header._M_right =
         local_398._M_impl.super__Rb_tree_header._M_header._M_left;
    local_368._M_impl.super__Rb_tree_header._M_header._M_right =
         local_368._M_impl.super__Rb_tree_header._M_header._M_left;
    local_338._M_impl.super__Rb_tree_header._M_header._M_right =
         local_338._M_impl.super__Rb_tree_header._M_header._M_left;
    local_308._M_impl.super__Rb_tree_header._M_header._M_right =
         local_308._M_impl.super__Rb_tree_header._M_header._M_left;
    local_2d8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_2d8._M_impl.super__Rb_tree_header._M_header._M_left;
    local_2a8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_2a8._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_001fd558:
    do {
      p_Var5 = p_Var5->_M_nxt;
      if (p_Var5 == (__node_base *)0x0) goto LAB_001fd5c2;
      pbVar2 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                &((_Prime_rehash_policy *)(p_Var5 + 2))->_M_max_load_factor;
      if (((char)pbVar2[1]._M_string_length != '\x01') || (this->CMP0071Accept != false)) {
        if (*(undefined1 *)((long)&pbVar2[1]._M_string_length + 1) == '\x01') {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_368,pbVar2);
        }
        if (*(undefined1 *)((long)&pbVar2[1]._M_string_length + 2) == '\x01') {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_3c8,pbVar2);
        }
        cVar1 = *(undefined1 *)((long)&pbVar2[1]._M_string_length + 4);
        if (*(undefined1 *)((long)&pbVar2[1]._M_string_length + 3) == '\x01') {
          p_Var7 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_440;
          if (cVar1 == '\0') {
            p_Var7 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_2a8;
          }
        }
        else {
          p_Var7 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_308;
          if (cVar1 == '\0') goto LAB_001fd558;
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>(p_Var7,pbVar2);
      }
    } while( true );
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_440,"AutoGen: Could not write file ",(allocator<char> *)&local_398);
  std::__cxx11::string::append((string *)local_440);
  cmSystemTools::Error((string *)local_440);
  std::__cxx11::string::~string((string *)local_440);
LAB_001fdb1e:
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  return (uVar4 & 5) == 0;
LAB_001fd5c2:
  p_Var5 = &(this->AutogenTarget).Sources._M_h._M_before_begin;
LAB_001fd5e1:
  do {
    p_Var5 = p_Var5->_M_nxt;
    if (p_Var5 == (__node_base *)0x0) break;
    pbVar2 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              &((_Prime_rehash_policy *)(p_Var5 + 2))->_M_max_load_factor;
    if (((char)pbVar2[1]._M_string_length != '\x01') || (this->CMP0071Accept != false)) {
      if (*(undefined1 *)((long)&pbVar2[1]._M_string_length + 1) == '\x01') {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_368,pbVar2);
      }
      if (*(undefined1 *)((long)&pbVar2[1]._M_string_length + 2) == '\x01') {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_3c8,pbVar2);
      }
      cVar1 = *(undefined1 *)((long)&pbVar2[1]._M_string_length + 4);
      if (*(undefined1 *)((long)&pbVar2[1]._M_string_length + 3) == '\x01') {
        p_Var7 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_398;
        if (cVar1 == '\0') {
          p_Var7 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_2d8;
        }
      }
      else {
        p_Var7 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_338;
        if (cVar1 == '\0') goto LAB_001fd5e1;
      }
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>(p_Var7,pbVar2);
    }
  } while( true );
  std::operator<<((ostream *)local_278,"# Qt\n");
  uVar4 = local_3ec;
  InfoWriter::WriteUInt((InfoWriter *)local_278,"AM_QT_VERSION_MAJOR",(this->QtVersion).Major);
  InfoWriter::Write((InfoWriter *)local_278,"AM_QT_MOC_EXECUTABLE",
                    &(this->Moc).super_GenVarsT.Executable);
  InfoWriter::Write((InfoWriter *)local_278,"AM_QT_UIC_EXECUTABLE",
                    &(this->Uic).super_GenVarsT.Executable);
  std::operator<<((ostream *)local_278,"# Files\n");
  InfoWriter::Write((InfoWriter *)local_278,"AM_SETTINGS_FILE",&(this->AutogenTarget).SettingsFile);
  InfoWriter::WriteConfig
            ((InfoWriter *)local_278,"AM_SETTINGS_FILE",&(this->AutogenTarget).ConfigSettingsFile);
  InfoWriter::
  WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
            ((InfoWriter *)local_278,"AM_HEADERS",
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_440);
  InfoWriter::
  WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
            ((InfoWriter *)local_278,"AM_SOURCES",
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_398);
  if ((this->Moc).super_GenVarsT.Enabled == true) {
    std::operator<<((ostream *)local_278,"# MOC settings\n");
    InfoWriter::
    WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)local_278,"AM_MOC_HEADERS",
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_2a8);
    InfoWriter::
    WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)local_278,"AM_MOC_SOURCES",
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_2d8);
    InfoWriter::
    WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)local_278,"AM_MOC_SKIP",
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_368);
    InfoWriter::
    WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)local_278,"AM_MOC_DEFINITIONS",&(this->Moc).Defines);
    InfoWriter::
    WriteConfigStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)local_278,"AM_MOC_DEFINITIONS",&(this->Moc).ConfigDefines);
    InfoWriter::WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)local_278,"AM_MOC_INCLUDES",&(this->Moc).Includes);
    InfoWriter::
    WriteConfigStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)local_278,"AM_MOC_INCLUDES",&(this->Moc).ConfigIncludes);
    pcVar3 = this->Target;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e8,"AUTOMOC_MOC_OPTIONS",&local_449);
    pcVar6 = cmGeneratorTarget::GetSafeProperty(pcVar3,&local_3e8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,pcVar6,&local_44a);
    InfoWriter::Write((InfoWriter *)local_278,"AM_MOC_OPTIONS",&local_410);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_3e8);
    SetupWriteAutogenInfo()::$_0::operator()[abi_cxx11_
              (&local_410,&local_448,"CMAKE_AUTOMOC_RELAXED_MODE");
    InfoWriter::Write((InfoWriter *)local_278,"AM_MOC_RELAXED_MODE",&local_410);
    std::__cxx11::string::~string((string *)&local_410);
    pcVar3 = this->Target;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e8,"AUTOMOC_MACRO_NAMES",&local_449);
    pcVar6 = cmGeneratorTarget::GetSafeProperty(pcVar3,&local_3e8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,pcVar6,&local_44a);
    InfoWriter::Write((InfoWriter *)local_278,"AM_MOC_MACRO_NAMES",&local_410);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_3e8);
    pcVar3 = this->Target;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e8,"AUTOMOC_DEPEND_FILTERS",&local_449);
    pcVar6 = cmGeneratorTarget::GetSafeProperty(pcVar3,&local_3e8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,pcVar6,&local_44a);
    InfoWriter::Write((InfoWriter *)local_278,"AM_MOC_DEPEND_FILTERS",&local_410);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_3e8);
    InfoWriter::Write((InfoWriter *)local_278,"AM_MOC_PREDEFS_CMD",&(this->Moc).PredefsCmd);
  }
  if ((this->Uic).super_GenVarsT.Enabled == true) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&local_3c8,(this->Uic).SkipUi._M_t._M_impl.super__Rb_tree_header._M_header._M_left
               ,(_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 )&(this->Uic).SkipUi._M_t._M_impl.super__Rb_tree_header);
    std::operator<<((ostream *)local_278,"# UIC settings\n");
    InfoWriter::
    WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)local_278,"AM_UIC_HEADERS",
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_308);
    InfoWriter::
    WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)local_278,"AM_UIC_SOURCES",
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_338);
    InfoWriter::
    WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)local_278,"AM_UIC_SKIP",
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_3c8);
    InfoWriter::WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)local_278,"AM_UIC_TARGET_OPTIONS",&(this->Uic).Options);
    InfoWriter::
    WriteConfigStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)local_278,"AM_UIC_TARGET_OPTIONS",&(this->Uic).ConfigOptions);
    InfoWriter::WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)local_278,"AM_UIC_OPTIONS_FILES",&(this->Uic).FileFiles);
    InfoWriter::WriteNestedLists
              ((InfoWriter *)local_278,"AM_UIC_OPTIONS_OPTIONS",&(this->Uic).FileOptions);
    InfoWriter::WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)local_278,"AM_UIC_SEARCH_PATHS",&(this->Uic).SearchPaths);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_3c8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_338);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_308);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_368);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_2d8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_2a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_398);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_440);
  goto LAB_001fdb1e;
}

Assistant:

bool cmQtAutoGenInitializer::SetupWriteAutogenInfo()
{
  InfoWriter ofs(this->AutogenTarget.InfoFile);
  if (ofs) {
    // Utility lambdas
    cmMakefile* makefile = this->Target->Target->GetMakefile();
    auto MfDef = [makefile](const char* key) {
      return makefile->GetSafeDefinition(key);
    };

    // Write common settings
    ofs.Write("# Meta\n");
    ofs.Write("AM_MULTI_CONFIG", this->MultiConfig ? "TRUE" : "FALSE");
    ofs.Write("AM_PARALLEL", this->AutogenTarget.Parallel);
    ofs.Write("AM_VERBOSITY", this->Verbosity);

    ofs.Write("# Directories\n");
    ofs.Write("AM_CMAKE_SOURCE_DIR", MfDef("CMAKE_SOURCE_DIR"));
    ofs.Write("AM_CMAKE_BINARY_DIR", MfDef("CMAKE_BINARY_DIR"));
    ofs.Write("AM_CMAKE_CURRENT_SOURCE_DIR",
              MfDef("CMAKE_CURRENT_SOURCE_DIR"));
    ofs.Write("AM_CMAKE_CURRENT_BINARY_DIR",
              MfDef("CMAKE_CURRENT_BINARY_DIR"));
    ofs.Write("AM_CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE",
              MfDef("CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE"));
    ofs.Write("AM_BUILD_DIR", this->Dir.Build);
    ofs.Write("AM_INCLUDE_DIR", this->Dir.Include);
    ofs.WriteConfig("AM_INCLUDE_DIR", this->Dir.ConfigInclude);

    // Use sorted sets
    std::set<std::string> headers;
    std::set<std::string> sources;
    std::set<std::string> moc_headers;
    std::set<std::string> moc_sources;
    std::set<std::string> moc_skip;
    std::set<std::string> uic_headers;
    std::set<std::string> uic_sources;
    std::set<std::string> uic_skip;
    // Filter headers
    for (auto const& pair : this->AutogenTarget.Headers) {
      MUFile const& muf = *pair.second;
      if (muf.Generated && !this->CMP0071Accept) {
        continue;
      }
      if (muf.SkipMoc) {
        moc_skip.insert(muf.RealPath);
      }
      if (muf.SkipUic) {
        uic_skip.insert(muf.RealPath);
      }
      if (muf.MocIt && muf.UicIt) {
        headers.insert(muf.RealPath);
      } else if (muf.MocIt) {
        moc_headers.insert(muf.RealPath);
      } else if (muf.UicIt) {
        uic_headers.insert(muf.RealPath);
      }
    }
    // Filter sources
    for (auto const& pair : this->AutogenTarget.Sources) {
      MUFile const& muf = *pair.second;
      if (muf.Generated && !this->CMP0071Accept) {
        continue;
      }
      if (muf.SkipMoc) {
        moc_skip.insert(muf.RealPath);
      }
      if (muf.SkipUic) {
        uic_skip.insert(muf.RealPath);
      }
      if (muf.MocIt && muf.UicIt) {
        sources.insert(muf.RealPath);
      } else if (muf.MocIt) {
        moc_sources.insert(muf.RealPath);
      } else if (muf.UicIt) {
        uic_sources.insert(muf.RealPath);
      }
    }

    ofs.Write("# Qt\n");
    ofs.WriteUInt("AM_QT_VERSION_MAJOR", this->QtVersion.Major);
    ofs.Write("AM_QT_MOC_EXECUTABLE", this->Moc.Executable);
    ofs.Write("AM_QT_UIC_EXECUTABLE", this->Uic.Executable);

    ofs.Write("# Files\n");
    ofs.Write("AM_SETTINGS_FILE", this->AutogenTarget.SettingsFile);
    ofs.WriteConfig("AM_SETTINGS_FILE",
                    this->AutogenTarget.ConfigSettingsFile);
    ofs.WriteStrings("AM_HEADERS", headers);
    ofs.WriteStrings("AM_SOURCES", sources);

    // Write moc settings
    if (this->Moc.Enabled) {
      ofs.Write("# MOC settings\n");
      ofs.WriteStrings("AM_MOC_HEADERS", moc_headers);
      ofs.WriteStrings("AM_MOC_SOURCES", moc_sources);
      ofs.WriteStrings("AM_MOC_SKIP", moc_skip);
      ofs.WriteStrings("AM_MOC_DEFINITIONS", this->Moc.Defines);
      ofs.WriteConfigStrings("AM_MOC_DEFINITIONS", this->Moc.ConfigDefines);
      ofs.WriteStrings("AM_MOC_INCLUDES", this->Moc.Includes);
      ofs.WriteConfigStrings("AM_MOC_INCLUDES", this->Moc.ConfigIncludes);
      ofs.Write("AM_MOC_OPTIONS",
                this->Target->GetSafeProperty("AUTOMOC_MOC_OPTIONS"));
      ofs.Write("AM_MOC_RELAXED_MODE", MfDef("CMAKE_AUTOMOC_RELAXED_MODE"));
      ofs.Write("AM_MOC_MACRO_NAMES",
                this->Target->GetSafeProperty("AUTOMOC_MACRO_NAMES"));
      ofs.Write("AM_MOC_DEPEND_FILTERS",
                this->Target->GetSafeProperty("AUTOMOC_DEPEND_FILTERS"));
      ofs.Write("AM_MOC_PREDEFS_CMD", this->Moc.PredefsCmd);
    }

    // Write uic settings
    if (this->Uic.Enabled) {
      // Add skipped .ui files
      uic_skip.insert(this->Uic.SkipUi.begin(), this->Uic.SkipUi.end());

      ofs.Write("# UIC settings\n");
      ofs.WriteStrings("AM_UIC_HEADERS", uic_headers);
      ofs.WriteStrings("AM_UIC_SOURCES", uic_sources);
      ofs.WriteStrings("AM_UIC_SKIP", uic_skip);
      ofs.WriteStrings("AM_UIC_TARGET_OPTIONS", this->Uic.Options);
      ofs.WriteConfigStrings("AM_UIC_TARGET_OPTIONS", this->Uic.ConfigOptions);
      ofs.WriteStrings("AM_UIC_OPTIONS_FILES", this->Uic.FileFiles);
      ofs.WriteNestedLists("AM_UIC_OPTIONS_OPTIONS", this->Uic.FileOptions);
      ofs.WriteStrings("AM_UIC_SEARCH_PATHS", this->Uic.SearchPaths);
    }
  } else {
    std::string err = "AutoGen: Could not write file ";
    err += this->AutogenTarget.InfoFile;
    cmSystemTools::Error(err);
    return false;
  }

  return true;
}